

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_import.c
# Opt level: O0

REF_STATUS ref_import_i_like_cfd_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi,char *filename)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_LONG ref_private_status_reis_bi_7;
  REF_LONG ref_private_status_reis_ai_7;
  REF_LONG ref_private_status_reis_bi_6;
  REF_LONG ref_private_status_reis_ai_6;
  REF_LONG ref_private_status_reis_bi_5;
  REF_LONG ref_private_status_reis_ai_5;
  REF_LONG ref_private_status_reis_bi_4;
  REF_LONG ref_private_status_reis_ai_4;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_LONG ref_private_status_reis_bi_3;
  REF_LONG ref_private_status_reis_ai_3;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  char local_508 [4];
  REF_STATUS ref_private_macro_code_rss;
  char line [1024];
  REF_DBL local_100;
  REF_DBL y;
  REF_DBL x;
  REF_INT n3;
  REF_INT n2;
  REF_INT n1;
  REF_INT n0;
  REF_INT *count;
  int local_d0;
  REF_INT i;
  REF_INT nid;
  REF_INT id;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT new_cell;
  REF_INT nquad;
  REF_INT ntri;
  REF_INT nnode;
  REF_INT new_node;
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID ref_grid;
  FILE *file;
  char *filename_local;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  file = (FILE *)filename;
  filename_local = (char *)ref_mpi;
  ref_mpi_local = (REF_MPI)ref_grid_ptr;
  uVar1 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar1 == 0) {
    ref_node = *(REF_NODE *)ref_mpi_local;
    _new_node = *(REF_NODE *)&ref_node->blank;
    *(undefined4 *)&ref_node[1].old_n_global = 1;
    ref_grid = (REF_GRID)fopen((char *)file,"r");
    if (ref_grid == (REF_GRID)0x0) {
      printf("unable to open %s\n",file);
    }
    if (ref_grid == (REF_GRID)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
             0x51c,"ref_import_i_like_cfd_grid","unable to open file");
      ref_grid_ptr_local._4_4_ = 2;
    }
    else {
      iVar2 = __isoc99_fscanf(ref_grid,"%d %d %d\n",&nquad,&new_cell,&cell);
      if ((long)iVar2 == 3) {
        for (nnode = 0; nnode < nquad; nnode = nnode + 1) {
          iVar2 = __isoc99_fscanf(ref_grid,"%lf %lf",&y,&local_100);
          if ((long)iVar2 != 2) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x522,"ref_import_i_like_cfd_grid","read xy",2,(long)iVar2);
            return 1;
          }
          uVar1 = ref_node_add(_new_node,(long)nnode,&ntri);
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x523,"ref_import_i_like_cfd_grid",(ulong)uVar1,"add node");
            return uVar1;
          }
          _new_node->real[ntri * 0xf] = y;
          _new_node->real[ntri * 0xf + 1] = local_100;
          _new_node->real[ntri * 0xf + 2] = 0.0;
        }
        uVar1 = ref_node_initialize_n_global(_new_node,(long)nquad);
        if (uVar1 == 0) {
          i = 1;
          for (nodes[0x19] = 0; nodes[0x19] < new_cell; nodes[0x19] = nodes[0x19] + 1) {
            iVar2 = __isoc99_fscanf(ref_grid,"%d %d %d",&n2,&n3,(long)&x + 4);
            if ((long)iVar2 != 3) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x52d,"ref_import_i_like_cfd_grid","read tri",3,(long)iVar2);
              return 1;
            }
            nid = n2 + -1;
            id = n3 + -1;
            nodes[0] = x._4_4_ + -1;
            nodes[1] = i;
            uVar1 = ref_cell_add((REF_CELL)ref_node->part,&nid,nodes + 0x1a);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x533,"ref_import_i_like_cfd_grid",(ulong)uVar1,"tri face for tri");
              return uVar1;
            }
          }
          for (nodes[0x19] = 0; nodes[0x19] < cell; nodes[0x19] = nodes[0x19] + 1) {
            iVar2 = __isoc99_fscanf(ref_grid,"%d %d %d %d",&n2,&n3,(long)&x + 4,&x);
            if ((long)iVar2 != 4) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x537,"ref_import_i_like_cfd_grid","read quad",4,(long)iVar2);
              return 1;
            }
            nid = n2 + -1;
            id = n3 + -1;
            nodes[0] = x._4_4_ + -1;
            nodes[1] = x._0_4_ + -1;
            nodes[2] = i;
            uVar1 = ref_cell_add(*(REF_CELL *)&ref_node->naux,&nid,nodes + 0x1a);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x53e,"ref_import_i_like_cfd_grid",(ulong)uVar1,"quad face for qua");
              return uVar1;
            }
          }
          iVar2 = __isoc99_fscanf(ref_grid,"%d\n",&local_d0);
          if ((long)iVar2 == 1) {
            if (local_d0 < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                     ,0x542,"ref_import_i_like_cfd_grid","malloc count of REF_INT negative");
              ref_grid_ptr_local._4_4_ = 1;
            }
            else {
              _n1 = malloc((long)local_d0 << 2);
              if (_n1 == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                       ,0x542,"ref_import_i_like_cfd_grid","malloc count of REF_INT NULL");
                ref_grid_ptr_local._4_4_ = 2;
              }
              else {
                for (i = 1; i <= local_d0; i = i + 1) {
                  iVar2 = __isoc99_fscanf(ref_grid,"%d\n",(void *)((long)_n1 + (long)(i + -1) * 4));
                  if ((long)iVar2 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x544,"ref_import_i_like_cfd_grid","elements in edge groups",1,
                           (long)iVar2);
                    return 1;
                  }
                }
                for (i = 1; i <= local_d0; i = i + 1) {
                  pcVar3 = fgets(local_508,0x400,(FILE *)ref_grid);
                  if (pcVar3 == (char *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x547,"ref_import_i_like_cfd_grid","read line for first edge node");
                    return 2;
                  }
                  iVar2 = __isoc99_sscanf(local_508,"%d",&n2);
                  if ((long)iVar2 != 1) {
                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                           ,0x548,"ref_import_i_like_cfd_grid","first edge node",1,(long)iVar2);
                    return 1;
                  }
                  for (count._4_4_ = 1; count._4_4_ < *(int *)((long)_n1 + (long)(i + -1) * 4);
                      count._4_4_ = count._4_4_ + 1) {
                    pcVar3 = fgets(local_508,0x400,(FILE *)ref_grid);
                    if (pcVar3 == (char *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x54a,"ref_import_i_like_cfd_grid","read line for first edge node");
                      return 2;
                    }
                    iVar2 = __isoc99_sscanf(local_508,"%d",&n3);
                    if ((long)iVar2 != 1) {
                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x54b,"ref_import_i_like_cfd_grid","next edge node",1,(long)iVar2);
                      return 1;
                    }
                    nid = n2 + -1;
                    id = n3 + -1;
                    nodes[0] = i;
                    uVar1 = ref_cell_add((REF_CELL)ref_node->global,&nid,nodes + 0x1a);
                    if (uVar1 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                             ,0x550,"ref_import_i_like_cfd_grid",(ulong)uVar1,"add edge to edg");
                      return uVar1;
                    }
                    n2 = n3;
                  }
                }
                if (_n1 != (void *)0x0) {
                  free(_n1);
                }
                fclose((FILE *)ref_grid);
                ref_grid_ptr_local._4_4_ = 0;
              }
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c"
                   ,0x541,"ref_import_i_like_cfd_grid","number of edge groups",1,(long)iVar2);
            ref_grid_ptr_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
                 0x528,"ref_import_i_like_cfd_grid",(ulong)uVar1,"init glob");
          ref_grid_ptr_local._4_4_ = uVar1;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",
               0x51f,"ref_import_i_like_cfd_grid","read nnode ntri nquad",3,(long)iVar2);
        ref_grid_ptr_local._4_4_ = 1;
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_import.c",0x514,
           "ref_import_i_like_cfd_grid",(ulong)uVar1,"create grid");
    ref_grid_ptr_local._4_4_ = uVar1;
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_import_i_like_cfd_grid(REF_GRID *ref_grid_ptr,
                                                     REF_MPI ref_mpi,
                                                     const char *filename) {
  FILE *file;
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT node, new_node;
  REF_INT nnode, ntri, nquad;
  REF_INT new_cell, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT id, nid, i;
  REF_INT *count;
  REF_INT n0, n1, n2, n3;
  REF_DBL x, y;
  char line[1024];

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create grid");
  ref_grid = (*ref_grid_ptr);
  ref_node = ref_grid_node(ref_grid);

  ref_grid_twod(ref_grid) = REF_TRUE;

  file = fopen(filename, "r");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  REIS(3, fscanf(file, "%d %d %d\n", &nnode, &ntri, &nquad),
       "read nnode ntri nquad");

  for (node = 0; node < nnode; node++) {
    REIS(2, fscanf(file, "%lf %lf", &x, &y), "read xy");
    RSS(ref_node_add(ref_node, node, &new_node), "add node");
    ref_node_xyz(ref_node, 0, new_node) = x;
    ref_node_xyz(ref_node, 1, new_node) = y;
    ref_node_xyz(ref_node, 2, new_node) = 0.0;
  }
  RSS(ref_node_initialize_n_global(ref_node, nnode), "init glob");

  id = 1;

  for (cell = 0; cell < ntri; cell++) {
    REIS(3, fscanf(file, "%d %d %d", &n0, &n1, &n2), "read tri");
    nodes[0] = n0 - 1;
    nodes[1] = n1 - 1;
    nodes[2] = n2 - 1;
    nodes[3] = id;
    RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &new_cell),
        "tri face for tri");
  }

  for (cell = 0; cell < nquad; cell++) {
    REIS(4, fscanf(file, "%d %d %d %d", &n0, &n1, &n2, &n3), "read quad");
    nodes[0] = n0 - 1;
    nodes[1] = n1 - 1;
    nodes[2] = n2 - 1;
    nodes[3] = n3 - 1;
    nodes[4] = id;
    RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell),
        "quad face for qua");
  }

  REIS(1, fscanf(file, "%d\n", &nid), "number of edge groups");
  ref_malloc(count, nid, REF_INT);
  for (id = 1; id <= nid; id++) {
    REIS(1, fscanf(file, "%d\n", &(count[id - 1])), "elements in edge groups");
  }
  for (id = 1; id <= nid; id++) {
    RNS(fgets(line, 1024, file), "read line for first edge node");
    REIS(1, sscanf(line, "%d", &n0), "first edge node");
    for (i = 1; i < count[id - 1]; i++) {
      RNS(fgets(line, 1024, file), "read line for first edge node");
      REIS(1, sscanf(line, "%d", &n1), "next edge node");
      nodes[0] = n0 - 1;
      nodes[1] = n1 - 1;
      nodes[2] = id;
      RSS(ref_cell_add(ref_grid_edg(ref_grid), nodes, &new_cell),
          "add edge to edg");
      n0 = n1;
    }
  }

  ref_free(count);

  fclose(file);

  return REF_SUCCESS;
}